

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID IVar5;
  ImGuiContext *g;
  long lStack_30;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  if (((GImGui->NavDisableMouseHover == true) && (((uint)flags >> 10 & 1) == 0)) &&
     (GImGui->NavDisableHighlight == false)) {
    if ((((uint)flags >> 9 & 1) != 0) || (((GImGui->LastItemData).InFlags & 4U) == 0)) {
      IVar5 = GImGui->NavId;
      if (IVar5 == 0) {
        return false;
      }
      if (IVar5 != (GImGui->LastItemData).ID) {
        return false;
      }
LAB_001c1028:
      if (((uint)flags >> 0xb & 1) == 0) {
        if (((uint)flags >> 0xc & 1) == 0) {
          return true;
        }
        lStack_30 = 0x48;
      }
      else {
        lStack_30 = 0x44;
      }
      fVar1 = *(float *)(&pIVar3->Initialized + lStack_30);
      if (fVar1 <= 0.0) {
        return true;
      }
      if (IVar5 == 0) {
        IVar5 = ImGuiWindow::GetIDFromRectangle(window,&(pIVar3->LastItemData).Rect);
      }
      if ((((uint)flags >> 0xd & 1) != 0) && (pIVar3->HoverDelayIdPreviousFrame != IVar5)) {
        pIVar3->HoverDelayTimer = 0.0;
      }
      pIVar3->HoverDelayId = IVar5;
      return fVar1 <= pIVar3->HoverDelayTimer;
    }
  }
  else {
    uVar2 = (GImGui->LastItemData).StatusFlags;
    if ((((uVar2 & 1) != 0) &&
        (((flags & 0x100U) != 0 || (uVar2 & 0x80) != 0 || (GImGui->HoveredWindow == window)))) &&
       (((char)flags < '\0' ||
        (((IVar5 = GImGui->ActiveId, IVar5 == 0 || (IVar5 == (GImGui->LastItemData).ID)) ||
         ((GImGui->ActiveIdAllowOverlap != false || (IVar5 == window->MoveId)))))))) {
      bVar4 = IsWindowContentHoverable(window,flags);
      uVar2 = (pIVar3->LastItemData).InFlags;
      if (((((byte)(uVar2 >> 8) & 1 | bVar4) == 1) &&
          ((((uint)flags >> 9 & 1) == 0 & (byte)((uVar2 & 4) >> 2)) == 0)) &&
         ((IVar5 = (pIVar3->LastItemData).ID, IVar5 != window->MoveId ||
          (window->WriteAccessed == false)))) goto LAB_001c1028;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavDisableMouseHover && !g.NavDisableHighlight && !(flags & ImGuiHoveredFlags_NoNavOverride))
    {
        if ((g.LastItemData.InFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
            return false;
        if (!IsItemFocused())
            return false;
    }
    else
    {
        // Test for bounding box overlap, as updated as ItemAdd()
        ImGuiItemStatusFlags status_flags = g.LastItemData.StatusFlags;
        if (!(status_flags & ImGuiItemStatusFlags_HoveredRect))
            return false;
        IM_ASSERT((flags & (ImGuiHoveredFlags_AnyWindow | ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows | ImGuiHoveredFlags_NoPopupHierarchy)) == 0);   // Flags not supported by this function

        // Done with rectangle culling so we can perform heavier checks now
        // Test if we are hovering the right window (our window could be behind another window)
        // [2021/03/02] Reworked / reverted the revert, finally. Note we want e.g. BeginGroup/ItemAdd/EndGroup to work as well. (#3851)
        // [2017/10/16] Reverted commit 344d48be3 and testing RootWindow instead. I believe it is correct to NOT test for RootWindow but this leaves us unable
        // to use IsItemHovered() after EndChild() itself. Until a solution is found I believe reverting to the test from 2017/09/27 is safe since this was
        // the test that has been running for a long while.
        if (g.HoveredWindow != window && (status_flags & ImGuiItemStatusFlags_HoveredWindow) == 0)
            if ((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0)
                return false;

        // Test if another item is active (e.g. being dragged)
        if ((flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem) == 0)
            if (g.ActiveId != 0 && g.ActiveId != g.LastItemData.ID && !g.ActiveIdAllowOverlap && g.ActiveId != window->MoveId)
                return false;

        // Test if interactions on this window are blocked by an active popup or modal.
        // The ImGuiHoveredFlags_AllowWhenBlockedByPopup flag will be tested here.
        if (!IsWindowContentHoverable(window, flags) && !(g.LastItemData.InFlags & ImGuiItemFlags_NoWindowHoverableCheck))
            return false;

        // Test if the item is disabled
        if ((g.LastItemData.InFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
            return false;

        // Special handling for calling after Begin() which represent the title bar or tab.
        // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
        if (g.LastItemData.ID == window->MoveId && window->WriteAccessed)
            return false;
    }

    // Handle hover delay
    // (some ideas: https://www.nngroup.com/articles/timing-exposing-content)
    float delay;
    if (flags & ImGuiHoveredFlags_DelayNormal)
        delay = g.IO.HoverDelayNormal;
    else if (flags & ImGuiHoveredFlags_DelayShort)
        delay = g.IO.HoverDelayShort;
    else
        delay = 0.0f;
    if (delay > 0.0f)
    {
        ImGuiID hover_delay_id = (g.LastItemData.ID != 0) ? g.LastItemData.ID : window->GetIDFromRectangle(g.LastItemData.Rect);
        if ((flags & ImGuiHoveredFlags_NoSharedDelay) && (g.HoverDelayIdPreviousFrame != hover_delay_id))
            g.HoverDelayTimer = 0.0f;
        g.HoverDelayId = hover_delay_id;
        return g.HoverDelayTimer >= delay;
    }

    return true;
}